

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* read_pid_statm(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *__return_storage_ptr__,string *path)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  allocator local_3c1;
  key_type local_3c0;
  allocator local_399;
  key_type local_398;
  allocator local_371;
  key_type local_370;
  allocator local_349;
  key_type local_348;
  allocator local_321;
  key_type local_320;
  allocator local_2f9;
  key_type local_2f8;
  allocator local_2d1;
  key_type local_2d0;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  string next_line;
  string line;
  istream local_220 [8];
  ifstream fin;
  string *path_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *result_map;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,path,8);
  std::__cxx11::string::string((string *)(next_line.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &info.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_220,
               (string *)
               &info.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator+=
              ((string *)(next_line.field_2._M_local_buf + 8),
               (string *)
               &info.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::ifstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"\\s+",&local_2a9);
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_288,(string *)((long)&next_line.field_2 + 8),&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  local_2aa = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(__return_storage_ptr__);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,0);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"vms",&local_2d1);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_2d0);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,1);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"rss",&local_2f9);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_2f8);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,2);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"shared",&local_321);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_320);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,3);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"text",&local_349);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_348);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,4);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"lib",&local_371);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_370);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,5);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"data",&local_399);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_398);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_288,6);
  iVar2 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
  iVar2 = iVar2 * PAGESIZE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"dirty",&local_3c1);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](__return_storage_ptr__,&local_3c0);
  *pmVar4 = iVar2;
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  local_2aa = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  std::__cxx11::string::~string
            ((string *)
             &info.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(next_line.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<std::string, int>
read_pid_statm(const std::string &path) {
    std::ifstream fin;
    fin.open(path);
    std::string line;
    std::string next_line;
    while (!fin.eof()) {
        getline(fin, next_line);
        line += next_line;
    }
    fin.close();

    std::vector<std::string> info = split(line, "\\s+");
    std::unordered_map<std::string, int> result_map;
    result_map["vms"] = stoi(info[0]) * PAGESIZE;
    result_map["rss"] = stoi(info[1]) * PAGESIZE;
    result_map["shared"] = stoi(info[2]) * PAGESIZE;
    result_map["text"] = stoi(info[3]) * PAGESIZE;
    result_map["lib"] = stoi(info[4]) * PAGESIZE;
    result_map["data"] = stoi(info[5]) * PAGESIZE;
    result_map["dirty"] = stoi(info[6]) * PAGESIZE;

    return result_map;
}